

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_tar.c
# Opt level: O0

void verifyEmpty(void)

{
  int iVar1;
  wchar_t wVar2;
  archive *a_00;
  char *v1;
  archive *a;
  archive_entry *ae;
  
  a_00 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                   ,L'C',(uint)(a_00 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                   ,L'D',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a_00);
  iVar1 = archive_read_support_format_all(a_00);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                   ,L'E',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a_00);
  iVar1 = archive_read_open_memory(a_00,archiveEmpty,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                   ,L'F',(uint)(iVar1 == 0),"0 == archive_read_open_memory(a, archiveEmpty, 512)",
                   a_00);
  iVar1 = archive_read_next_header(a_00,(archive_entry **)&a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                      ,L'G',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a_00);
  iVar1 = archive_filter_code(a_00,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                      ,L'H',(long)iVar1,"archive_filter_code(a, 0)",0,"ARCHIVE_FILTER_NONE",
                      (void *)0x0);
  v1 = archive_filter_name(a_00,0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
             ,L'I',v1,"archive_filter_name(a, 0)","none","\"none\"",(void *)0x0,L'\0');
  failure("512 zero bytes should be recognized as a tar archive.");
  iVar1 = archive_format(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                      ,L'K',(long)iVar1,"archive_format(a)",0x30000,"ARCHIVE_FORMAT_TAR",(void *)0x0
                     );
  wVar2 = archive_entry_is_encrypted((archive_entry *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                      ,L'L',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                      ,L'M',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a_00);
  iVar1 = archive_read_close(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                      ,L'O',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a_00);
  iVar1 = archive_read_free(a_00);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_tar.c"
                      ,L'P',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

static void verifyEmpty(void)
{
	struct archive_entry *ae;
	struct archive *a;

	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_open_memory(a, archiveEmpty, 512));
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_NONE);
	assertEqualString(archive_filter_name(a, 0), "none");
	failure("512 zero bytes should be recognized as a tar archive.");
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}